

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

segment_t * kiste::parse_command(segment_t *__return_storage_ptr__,string *line,size_t pos)

{
  bool bVar1;
  size_t sVar2;
  parse_error *ppVar3;
  char *pcVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [13];
  size_t local_20;
  size_t pos_local;
  string *line_local;
  
  local_20 = pos;
  pos_local = (size_t)line;
  line_local = (string *)__return_storage_ptr__;
  sVar2 = std::__cxx11::string::size();
  if (pos == sVar2) {
    ppVar3 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar3,"Missing command after \'$\'");
    __cxa_throw(ppVar3,&parse_error::typeinfo,parse_error::~parse_error);
  }
  pcVar4 = (char *)std::__cxx11::string::at(pos_local);
  if (*pcVar4 == '$') {
    __return_storage_ptr__->_end_pos = local_20;
    __return_storage_ptr__->_type = text;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__return_storage_ptr__->_text,"$",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::at(pos_local);
    if (*pcVar4 == '%') {
      __return_storage_ptr__->_end_pos = local_20;
      __return_storage_ptr__->_type = text;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__return_storage_ptr__->_text,"%",&local_2e);
      std::allocator<char>::~allocator(&local_2e);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::at(pos_local);
      sVar2 = local_20;
      if (*pcVar4 == '|') {
        lVar5 = std::__cxx11::string::size();
        if (sVar2 != lVar5 - 1U) {
          ppVar3 = (parse_error *)__cxa_allocate_exception(0x10);
          parse_error::parse_error(ppVar3,"Trailing characters after trim-right ($|)");
          __cxa_throw(ppVar3,&parse_error::typeinfo,parse_error::~parse_error);
        }
        __return_storage_ptr__->_end_pos = local_20;
        __return_storage_ptr__->_type = trim_trailing_return;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__return_storage_ptr__->_text,"",&local_2f);
        std::allocator<char>::~allocator(&local_2f);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::at(pos_local);
        if (*pcVar4 == '{') {
          parse_expression(__return_storage_ptr__,(string *)pos_local,escape,local_20 + 1);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_50,pos_local);
          bVar1 = std::operator==(&local_50,"raw{");
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            parse_expression(__return_storage_ptr__,(string *)pos_local,raw,local_20 + 4);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_70,pos_local);
            bVar1 = std::operator==(&local_70,"call{");
            std::__cxx11::string::~string((string *)&local_70);
            if (!bVar1) {
              ppVar3 = (parse_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::substr((ulong)&local_b0,pos_local);
              std::operator+(&local_90,"Unknown command: ",&local_b0);
              parse_error::parse_error(ppVar3,&local_90);
              __cxa_throw(ppVar3,&parse_error::typeinfo,parse_error::~parse_error);
            }
            parse_expression(__return_storage_ptr__,(string *)pos_local,call,local_20 + 5);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse_command(const std::string& line, std::size_t pos) -> segment_t
  {
    // std::clog << "----------------------------------" << std::endl;
    // std::clog << "line: " << line.substr(pos) << std::endl;
    if (pos == line.size())
    {
      throw parse_error("Missing command after '$'");
    }
    else if (line.at(pos) == '$')
    {
      return {pos, segment_type::text, "$"};
    }
    else if (line.at(pos) == '%')
    {
      return {pos, segment_type::text, "%"};
    }
    else if (line.at(pos) == '|')
    {
      if (pos != line.size() - 1)
      {
        throw parse_error("Trailing characters after trim-right ($|)");
      }
      return {pos, segment_type::trim_trailing_return, ""};
    }
    else if (line.at(pos) == '{')
    {
      return parse_expression(line, segment_type::escape, pos + 1);
    }
    else if (line.substr(pos, 4) == "raw{")
    {
      return parse_expression(line, segment_type::raw, pos + 4);
    }
    else if (line.substr(pos, 5) == "call{")
    {
      return parse_expression(line, segment_type::call, pos + 5);
    }
    else
    {
      throw parse_error("Unknown command: " + line.substr(pos));
    }
  }